

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O2

void testTinySVD(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing TinySVD algorithms in single precision..."
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  testTinySVDImp<float>();
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing TinySVD algorithms in double precision..."
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  testTinySVDImp<double>();
  return;
}

Assistant:

void
testTinySVD ()
{
    std::cout << "Testing TinySVD algorithms in single precision..."
              << std::endl;
    testTinySVDImp<float> ();

    std::cout << "Testing TinySVD algorithms in double precision..."
              << std::endl;
    testTinySVDImp<double> ();
}